

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict get_compound_literal(node_t_conflict n,int *addr_p)

{
  node_code_t nVar1;
  node_t_conflict pnVar2;
  int iVar3;
  
  pnVar2 = (node_t_conflict)0x0;
  if (n == (node_t_conflict)0x0) {
    return pnVar2;
  }
  iVar3 = 0;
  do {
    nVar1 = n->code;
    if ((int)nVar1 < 0x35) {
      if (nVar1 != N_ADDR) {
        if (2 < nVar1 - N_STR) {
          return pnVar2;
        }
LAB_0018573a:
        if (-1 < iVar3) {
          *addr_p = (uint)(iVar3 != 0);
          return n;
        }
        return (node_t_conflict)0x0;
      }
      iVar3 = iVar3 + 1;
    }
    else if (nVar1 == N_DEREF) {
      iVar3 = iVar3 + -1;
    }
    else if (nVar1 != N_CAST) {
      if (nVar1 != N_COMPOUND_LITERAL) {
        return pnVar2;
      }
      goto LAB_0018573a;
    }
    if (iVar3 - 2U < 0xfffffffd) {
      return pnVar2;
    }
    n = (n->u).ops.head;
    if (n == (node_t)0x0) {
      return pnVar2;
    }
  } while( true );
}

Assistant:

static node_t get_compound_literal (node_t n, int *addr_p) {
  for (int addr = 0; n != NULL; n = NL_HEAD (n->u.ops)) {
    switch (n->code) {
    case N_ADDR: addr++; break;
    case N_DEREF: addr--; break;
    case N_CAST: break;  // ???
    case N_STR:
    case N_STR16:
    case N_STR32:
    case N_COMPOUND_LITERAL:
      if (addr < 0) return NULL;
      *addr_p = addr > 0;
      return n;
      break;
    default: return NULL;
    }
    if (addr != -1 && addr != 0 && addr != 1) return NULL;
  }
  return NULL;
}